

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O2

int uv_loop_init(uv_loop_t *loop)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  uint64_t uVar5;
  uint uVar6;
  
  pvVar4 = loop->data;
  memset(&loop->active_handles,0,0x348);
  loop->data = pvVar4;
  pvVar4 = uv__calloc(1,0x1e0);
  if (pvVar4 == (void *)0x0) {
    iVar3 = -0xc;
  }
  else {
    loop->internal_fields = pvVar4;
    iVar3 = uv_mutex_init((uv_mutex_t *)((long)pvVar4 + 0x98));
    if (iVar3 == 0) {
      *(undefined8 *)((long)pvVar4 + 0x78) = 0;
      *(undefined8 *)((long)pvVar4 + 0x80) = 0;
      *(undefined8 *)((long)pvVar4 + 0x68) = 0;
      *(undefined8 *)((long)pvVar4 + 0x70) = 0;
      *(undefined8 *)((long)pvVar4 + 0x58) = 0;
      *(undefined8 *)((long)pvVar4 + 0x60) = 0;
      *(undefined8 *)((long)pvVar4 + 0x48) = 0;
      *(undefined8 *)((long)pvVar4 + 0x50) = 0;
      *(undefined8 *)((long)pvVar4 + 0x38) = 0;
      *(undefined8 *)((long)pvVar4 + 0x40) = 0;
      *(undefined8 *)((long)pvVar4 + 0x28) = 0;
      *(undefined8 *)((long)pvVar4 + 0x30) = 0;
      *(undefined8 *)((long)pvVar4 + 0x18) = 0;
      *(undefined8 *)((long)pvVar4 + 0x20) = 0;
      *(undefined8 *)((long)pvVar4 + 8) = 0;
      *(undefined8 *)((long)pvVar4 + 0x10) = 0;
      (loop->timer_heap).min = (void *)0x0;
      (loop->timer_heap).nelts = 0;
      (loop->wq).next = &loop->wq;
      (loop->wq).prev = &loop->wq;
      (loop->idle_handles).next = &loop->idle_handles;
      (loop->idle_handles).prev = &loop->idle_handles;
      (loop->async_handles).next = &loop->async_handles;
      (loop->async_handles).prev = &loop->async_handles;
      (loop->check_handles).next = &loop->check_handles;
      (loop->check_handles).prev = &loop->check_handles;
      (loop->prepare_handles).next = &loop->prepare_handles;
      (loop->prepare_handles).prev = &loop->prepare_handles;
      (loop->handle_queue).next = &loop->handle_queue;
      (loop->handle_queue).prev = &loop->handle_queue;
      loop->active_handles = 0;
      (loop->active_reqs).count = 0;
      loop->watchers = (uv__io_t **)0x0;
      loop->nwatchers = 0;
      loop->nfds = 0;
      (loop->pending_queue).next = &loop->pending_queue;
      (loop->pending_queue).prev = &loop->pending_queue;
      (loop->watcher_queue).next = &loop->watcher_queue;
      (loop->watcher_queue).prev = &loop->watcher_queue;
      loop->closing_handles = (uv_handle_t *)0x0;
      uVar5 = uv__hrtime(UV_CLOCK_FAST);
      loop->time = uVar5 / 1000000;
      (loop->async_io_watcher).fd = -1;
      loop->async_wfd = -1;
      loop->signal_pipefd[0] = -1;
      loop->signal_pipefd[1] = -1;
      loop->backend_fd = -1;
      loop->emfile_fd = -1;
      loop->timer_counter = 0;
      loop->stop_flag = 0;
      iVar3 = uv__platform_loop_init(loop);
      if (iVar3 == 0) {
        uv__signal_global_once_init();
        iVar3 = uv__process_init(loop);
        if (iVar3 == 0) {
          (loop->process_handles).next = &loop->process_handles;
          (loop->process_handles).prev = &loop->process_handles;
          iVar3 = uv_rwlock_init(&loop->cloexec_lock);
          if (iVar3 == 0) {
            iVar3 = uv_mutex_init(&loop->wq_mutex);
            if (iVar3 == 0) {
              iVar3 = uv_async_init(loop,&loop->wq_async,uv__work_done);
              if (iVar3 == 0) {
                uVar2 = (loop->wq_async).flags;
                uVar6 = uVar2;
                if ((uVar2 & 8) != 0) {
                  uVar6 = uVar2 & 0xfffffff7;
                  (loop->wq_async).flags = uVar6;
                  if ((uVar2 & 5) == 4) {
                    puVar1 = &((loop->wq_async).loop)->active_handles;
                    *puVar1 = *puVar1 - 1;
                    uVar6 = (loop->wq_async).flags;
                  }
                }
                (loop->wq_async).flags = uVar6 | 0x10;
                return 0;
              }
              uv_mutex_destroy(&loop->wq_mutex);
            }
            uv_rwlock_destroy(&loop->cloexec_lock);
          }
          uv__signal_loop_cleanup(loop);
        }
        uv__platform_loop_delete(loop);
      }
      uv_mutex_destroy((uv_mutex_t *)((long)pvVar4 + 0x98));
    }
    uv__free(pvVar4);
    loop->internal_fields = (void *)0x0;
    uv__free(loop->watchers);
    loop->nwatchers = 0;
  }
  return iVar3;
}

Assistant:

int uv_loop_init(uv_loop_t* loop) {
  uv__loop_internal_fields_t* lfields;
  void* saved_data;
  int err;


  saved_data = loop->data;
  memset(loop, 0, sizeof(*loop));
  loop->data = saved_data;

  lfields = (uv__loop_internal_fields_t*) uv__calloc(1, sizeof(*lfields));
  if (lfields == NULL)
    return UV_ENOMEM;
  loop->internal_fields = lfields;

  err = uv_mutex_init(&lfields->loop_metrics.lock);
  if (err)
    goto fail_metrics_mutex_init;
  memset(&lfields->loop_metrics.metrics,
         0,
         sizeof(lfields->loop_metrics.metrics));

  heap_init((struct heap*) &loop->timer_heap);
  uv__queue_init(&loop->wq);
  uv__queue_init(&loop->idle_handles);
  uv__queue_init(&loop->async_handles);
  uv__queue_init(&loop->check_handles);
  uv__queue_init(&loop->prepare_handles);
  uv__queue_init(&loop->handle_queue);

  loop->active_handles = 0;
  loop->active_reqs.count = 0;
  loop->nfds = 0;
  loop->watchers = NULL;
  loop->nwatchers = 0;
  uv__queue_init(&loop->pending_queue);
  uv__queue_init(&loop->watcher_queue);

  loop->closing_handles = NULL;
  uv__update_time(loop);
  loop->async_io_watcher.fd = -1;
  loop->async_wfd = -1;
  loop->signal_pipefd[0] = -1;
  loop->signal_pipefd[1] = -1;
  loop->backend_fd = -1;
  loop->emfile_fd = -1;

  loop->timer_counter = 0;
  loop->stop_flag = 0;

  err = uv__platform_loop_init(loop);
  if (err)
    goto fail_platform_init;

  uv__signal_global_once_init();
  err = uv__process_init(loop);
  if (err)
    goto fail_signal_init;
  uv__queue_init(&loop->process_handles);

  err = uv_rwlock_init(&loop->cloexec_lock);
  if (err)
    goto fail_rwlock_init;

  err = uv_mutex_init(&loop->wq_mutex);
  if (err)
    goto fail_mutex_init;

  err = uv_async_init(loop, &loop->wq_async, uv__work_done);
  if (err)
    goto fail_async_init;

  uv__handle_unref(&loop->wq_async);
  loop->wq_async.flags |= UV_HANDLE_INTERNAL;

  return 0;

fail_async_init:
  uv_mutex_destroy(&loop->wq_mutex);

fail_mutex_init:
  uv_rwlock_destroy(&loop->cloexec_lock);

fail_rwlock_init:
  uv__signal_loop_cleanup(loop);

fail_signal_init:
  uv__platform_loop_delete(loop);

fail_platform_init:
  uv_mutex_destroy(&lfields->loop_metrics.lock);

fail_metrics_mutex_init:
  uv__free(lfields);
  loop->internal_fields = NULL;

  uv__free(loop->watchers);
  loop->nwatchers = 0;
  return err;
}